

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.h
# Opt level: O3

RecyclerTestObject * __thiscall Location::Get(Location *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  RecyclerTestObject *pRVar4;
  size_t __n;
  Recycler *this_00;
  _func_int **pp_Var5;
  RecyclerTestObject *extraout_RAX;
  RecyclerTestObject **ppRVar6;
  RecyclerTestObject *extraout_RAX_00;
  RecyclerTestObject *in_RSI;
  undefined4 *in_FS_OFFSET;
  RecyclerHeapObjectInfo RStack_60;
  
  switch(this->type) {
  case Scanned:
  case Rooted:
  case Barrier:
    return *this->location;
  case Tagged:
switchD_001b9ed7_caseD_3:
    pRVar4 = Untag(*this->location);
    return pRVar4;
  case ImplicitRoot:
    if (*this->location == (RecyclerTestObject *)0x0) {
      pRVar4 = (RecyclerTestObject *)0x0;
    }
    else {
      pRVar4 = (RecyclerTestObject *)
               ((*this->location)->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject;
      if (pRVar4 == (RecyclerTestObject *)0x0) {
        Get();
        goto switchD_001b9ed7_caseD_3;
      }
    }
    return pRVar4;
  }
  Get();
  switch(this->type) {
  case Scanned:
    pRVar4 = (RecyclerTestObject *)this->location;
    (pRVar4->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject = (_func_int **)in_RSI;
    break;
  case Rooted:
    ppRVar6 = this->location;
    if (*ppRVar6 != (RecyclerTestObject *)0x0) {
      Memory::Recycler::RootRelease(recyclerInstance,*ppRVar6,(uint *)0x0);
      ppRVar6 = this->location;
    }
    *ppRVar6 = in_RSI;
    pRVar4 = (RecyclerTestObject *)this->location;
    pp_Var5 = (pRVar4->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject;
    if (pp_Var5 != (_func_int **)0x0) {
      Memory::Recycler::RootAddRef(recyclerInstance,pp_Var5,(uint *)0x0);
      return extraout_RAX_00;
    }
    break;
  case Barrier:
    pRVar4 = (RecyclerTestObject *)this->location;
    (pRVar4->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject = (_func_int **)in_RSI;
    if (in_RSI != (RecyclerTestObject *)0x0) {
      Memory::RecyclerWriteBarrierManager::WriteBarrier(this->location);
      return extraout_RAX;
    }
    break;
  case Tagged:
    pRVar4 = Tag(in_RSI);
    *this->location = pRVar4;
    break;
  case ImplicitRoot:
    pRVar4 = (RecyclerTestObject *)this->location;
    pp_Var5 = (pRVar4->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject;
    if (pp_Var5 == (_func_int **)0x0) {
LAB_001b9fb7:
      if (in_RSI == (RecyclerTestObject *)0x0) {
        return pRVar4;
      }
      RStack_60.m_address = &ImplicitRootHolder::typeinfo;
      RStack_60.m_recycler = (Recycler *)0x0;
      RStack_60.m_heapBlock = (HeapBlock *)0xffffffffffffffff;
      RStack_60.field_3.m_attributes =
           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/GCStress.h"
      ;
      RStack_60._32_4_ = 0xa2;
      this_00 = Memory::Recycler::TrackAllocInfo(recyclerInstance,(TrackAllocData *)&RStack_60);
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_001ba163;
        *in_FS_OFFSET = 0;
      }
      pp_Var5 = (_func_int **)
                Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)8,true>(this_00,8)
      ;
      if (pp_Var5 != (_func_int **)0x0) {
LAB_001ba0b9:
        Memory::Recycler::WBSetBit((char *)pp_Var5);
        *pp_Var5 = (_func_int *)in_RSI;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pp_Var5);
        pRVar4 = (RecyclerTestObject *)this->location;
        (pRVar4->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject = pp_Var5;
        return pRVar4;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
      if (bVar2) {
        *in_FS_OFFSET = 0;
        goto LAB_001ba0b9;
      }
      goto LAB_001ba163;
    }
    RStack_60.m_heapBlock = (HeapBlock *)0x0;
    RStack_60.field_3.m_attributes = (byte *)0x0;
    RStack_60.m_address = (pointer_____offset_0x10___ *)0x0;
    RStack_60.m_recycler = (Recycler *)0x0;
    RStack_60._32_4_ = RStack_60._32_4_ & 0xffffff00;
    bVar2 = Memory::Recycler::FindHeapObject
                      (recyclerInstance,pp_Var5,FindHeapObjectFlags_VerifyFreeBitForAttribute,
                       &RStack_60);
    if (!bVar2) goto LAB_001ba159;
    __n = Memory::RecyclerHeapObjectInfo::GetSize(&RStack_60);
    memset(pp_Var5,0,__n);
    bVar2 = Memory::RecyclerHeapObjectInfo::ClearImplicitRootBit(&RStack_60);
    if (bVar2) {
      pRVar4 = (RecyclerTestObject *)this->location;
      (pRVar4->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject = (_func_int **)0x0;
      goto LAB_001b9fb7;
    }
    goto LAB_001ba15e;
  default:
    Set();
LAB_001ba159:
    Set();
LAB_001ba15e:
    Set();
LAB_001ba163:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return pRVar4;
}

Assistant:

RecyclerTestObject * Get()
    {
        switch (type)
        {
            case Type::Scanned:
                return *location;

            case Type::Rooted:
                return *location;

            case Type::Barrier:
                return *location;

            case Type::Tagged:
                return Untag(*location);

            case Type::ImplicitRoot:
                // The stored location actually contains a pointer to the ImplicitRootHolder
                ImplicitRootHolder * holder = (ImplicitRootHolder *)(*location);
                if (holder == nullptr)
                {
                    return nullptr;
                }

                return holder->GetReference();
        }

        // Shouldn't get here
        VerifyCondition(false);
        return nullptr;
    }